

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O0

void __thiscall
capnp::compiler::ValueTranslator::fillStructValue
          (ValueTranslator *this,Builder builder,Reader assignments)

{
  int *__return_storage_ptr__;
  ErrorReporter *pEVar1;
  SegmentReader *pSVar2;
  CapTableReader *pCVar3;
  void *pvVar4;
  WirePointer *pWVar5;
  undefined4 uVar6;
  undefined2 uVar7;
  undefined2 uVar8;
  Reader src;
  Builder builder_00;
  Reader src_00;
  Reader src_01;
  Field field_00;
  Field field_01;
  Reader assignments_00;
  undefined1 auVar9 [8];
  StructSchema SVar10;
  SegmentBuilder *pSVar11;
  CapTableBuilder *pCVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  bool bVar16;
  Which WVar17;
  uint uVar18;
  NullableValue<capnp::StructSchema::Field> *other;
  Field *pFVar19;
  NullableValue<capnp::Orphan<capnp::DynamicValue>_> *other_00;
  Orphan<capnp::DynamicValue> *pOVar20;
  char (*params) [20];
  char (*in_R8) [3];
  Iterator IVar21;
  StringPtr name;
  Type TVar22;
  ArrayPtr<const_char> AVar23;
  String local_640;
  ArrayPtr<const_char> local_628;
  Reader local_618;
  ArrayPtr<const_char> local_5e8;
  String local_5d8;
  ArrayPtr<const_char> local_5c0;
  ArrayPtr<const_char> local_5b0;
  int local_59c;
  word *local_598;
  Schema SStack_590;
  uint local_588;
  undefined4 uStack_584;
  SegmentReader *pSStack_580;
  CapTableReader *local_578;
  void *pvStack_570;
  WirePointer *local_568;
  StructDataBitCount SStack_560;
  StructPointerCount SStack_55c;
  undefined2 uStack_55a;
  Type local_558;
  word *local_548;
  SegmentReader *pSStack_540;
  CapTableReader *local_538;
  void *pvStack_530;
  WirePointer *local_528;
  StructDataBitCount SStack_520;
  StructPointerCount SStack_51c;
  undefined2 uStack_51a;
  Type local_518;
  word *local_508;
  SegmentReader *pSStack_500;
  CapTableReader *local_4f8;
  void *pvStack_4f0;
  WirePointer *local_4e8;
  StructDataBitCount SStack_4e0;
  StructPointerCount SStack_4dc;
  undefined2 uStack_4da;
  undefined1 local_4d0 [8];
  Orphan<capnp::DynamicValue> result;
  Field groupField;
  undefined1 local_450 [8];
  FieldList groupFields;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  Builder local_378;
  undefined1 auStack_338 [8];
  BuilderFor<capnp::DynamicStruct> groupBuilder;
  Orphan<capnp::DynamicValue> *compiledValue;
  Maybe<capnp::Orphan<capnp::DynamicValue>_> local_270;
  undefined1 local_230 [8];
  NullableValue<capnp::Orphan<capnp::DynamicValue>_> _compiledValue2214;
  Reader value;
  Reader fieldProto;
  Field *field;
  Schema local_150;
  Maybe<capnp::StructSchema::Field> local_148;
  undefined1 local_100 [8];
  NullableValue<capnp::StructSchema::Field> _field2208;
  Reader fieldName;
  Reader assignment;
  undefined1 local_48 [8];
  Iterator __end2;
  undefined1 local_28 [8];
  Iterator __begin2;
  Reader *__range2;
  ValueTranslator *this_local;
  
  __begin2._8_8_ = &assignments;
  IVar21 = List<capnp::compiler::Expression::Param,_(capnp::Kind)3>::Reader::begin
                     ((Reader *)__begin2._8_8_);
  __end2._8_8_ = IVar21.container;
  __begin2.container._0_4_ = IVar21.index;
  local_28 = (undefined1  [8])__end2._8_8_;
  IVar21 = List<capnp::compiler::Expression::Param,_(capnp::Kind)3>::Reader::end
                     ((Reader *)__begin2._8_8_);
  local_48 = (undefined1  [8])IVar21.container;
  __end2.container._0_4_ = IVar21.index;
  do {
    bVar16 = capnp::_::
             IndexingIterator<const_capnp::List<capnp::compiler::Expression::Param,_(capnp::Kind)3>::Reader,_capnp::compiler::Expression::Param::Reader>
             ::operator==((IndexingIterator<const_capnp::List<capnp::compiler::Expression::Param,_(capnp::Kind)3>::Reader,_capnp::compiler::Expression::Param::Reader>
                           *)local_28,
                          (IndexingIterator<const_capnp::List<capnp::compiler::Expression::Param,_(capnp::Kind)3>::Reader,_capnp::compiler::Expression::Param::Reader>
                           *)local_48);
    if (((bVar16 ^ 0xffU) & 1) == 0) {
      return;
    }
    capnp::_::
    IndexingIterator<const_capnp::List<capnp::compiler::Expression::Param,_(capnp::Kind)3>::Reader,_capnp::compiler::Expression::Param::Reader>
    ::operator*((Reader *)&fieldName._reader.nestingLimit,
                (IndexingIterator<const_capnp::List<capnp::compiler::Expression::Param,_(capnp::Kind)3>::Reader,_capnp::compiler::Expression::Param::Reader>
                 *)local_28);
    bVar16 = Expression::Param::Reader::isNamed((Reader *)&fieldName._reader.nestingLimit);
    if (bVar16) {
      __return_storage_ptr__ = &_field2208.field_1.value.proto._reader.nestingLimit;
      Expression::Param::Reader::getNamed
                ((Reader *)__return_storage_ptr__,(Reader *)&fieldName._reader.nestingLimit);
      local_150.raw = (RawBrandedSchema *)DynamicStruct::Builder::getSchema(&builder);
      name.content = (ArrayPtr<const_char>)
                     LocatedText::Reader::getValue((Reader *)__return_storage_ptr__);
      StructSchema::findFieldByName(&local_148,(StructSchema *)&local_150,name);
      other = kj::_::readMaybe<capnp::StructSchema::Field>(&local_148);
      kj::_::NullableValue<capnp::StructSchema::Field>::NullableValue
                ((NullableValue<capnp::StructSchema::Field> *)local_100,other);
      kj::Maybe<capnp::StructSchema::Field>::~Maybe(&local_148);
      pFVar19 = kj::_::NullableValue::operator_cast_to_Field_((NullableValue *)local_100);
      if (pFVar19 == (Field *)0x0) {
        pEVar1 = this->errorReporter;
        AVar23 = (ArrayPtr<const_char>)
                 LocatedText::Reader::getValue
                           ((Reader *)&_field2208.field_1.value.proto._reader.nestingLimit);
        local_5e8 = AVar23;
        kj::str<char_const(&)[28],capnp::Text::Reader,char_const(&)[3]>
                  (&local_5d8,(kj *)"Struct has no field named \'",(char (*) [28])&local_5e8,
                   (Reader *)0x2dc429,in_R8);
        kj::StringPtr::StringPtr((StringPtr *)&local_5c0,&local_5d8);
        ErrorReporter::addErrorOn<capnp::compiler::LocatedText::Reader&>
                  (pEVar1,(Reader *)&_field2208.field_1.value.proto._reader.nestingLimit,
                   (StringPtr)local_5c0);
        kj::String::~String(&local_5d8);
      }
      else {
        pFVar19 = kj::_::NullableValue<capnp::StructSchema::Field>::operator*
                            ((NullableValue<capnp::StructSchema::Field> *)local_100);
        StructSchema::Field::getProto((Reader *)&value._reader.nestingLimit,pFVar19);
        Expression::Param::Reader::getValue
                  ((Reader *)&_compiledValue2214.field_1.value.builder.location,
                   (Reader *)&fieldName._reader.nestingLimit);
        WVar17 = capnp::schema::Field::Reader::which((Reader *)&value._reader.nestingLimit);
        uVar14 = value._reader._32_8_;
        pWVar5 = value._reader.pointers;
        pvVar4 = value._reader.data;
        pCVar3 = value._reader.capTable;
        pSVar2 = value._reader.segment;
        uVar13 = _compiledValue2214.field_1.value.builder.location;
        if (WVar17 == SLOT) {
          TVar22 = StructSchema::Field::getType(pFVar19);
          uVar15 = value._reader._32_8_;
          src._reader.capTable = (CapTableReader *)pSVar2;
          src._reader.segment = (SegmentReader *)uVar13;
          src._reader.data = pCVar3;
          src._reader.pointers = (WirePointer *)pvVar4;
          src._reader._32_8_ = pWVar5;
          value._reader.dataSize = (StructDataBitCount)uVar14;
          value._reader.pointerCount = SUB82(uVar14,4);
          value._reader._38_2_ = SUB82(uVar14,6);
          src._reader.nestingLimit = value._reader.dataSize;
          src._reader._44_2_ = value._reader.pointerCount;
          src._reader._46_2_ = value._reader._38_2_;
          value._reader._32_8_ = uVar15;
          compileValue(&local_270,this,src,TVar22);
          other_00 = kj::_::readMaybe<capnp::Orphan<capnp::DynamicValue>>(&local_270);
          kj::_::NullableValue<capnp::Orphan<capnp::DynamicValue>_>::NullableValue
                    ((NullableValue<capnp::Orphan<capnp::DynamicValue>_> *)local_230,other_00);
          kj::Maybe<capnp::Orphan<capnp::DynamicValue>_>::~Maybe(&local_270);
          pOVar20 = kj::_::NullableValue::operator_cast_to_Orphan_((NullableValue *)local_230);
          if (pOVar20 != (Orphan<capnp::DynamicValue> *)0x0) {
            pOVar20 = kj::_::NullableValue<capnp::Orphan<capnp::DynamicValue>_>::operator*
                                ((NullableValue<capnp::Orphan<capnp::DynamicValue>_> *)local_230);
            groupBuilder.builder._32_8_ = (pFVar19->parent).super_Schema.raw;
            pSVar2 = (pFVar19->proto)._reader.segment;
            pCVar3 = (pFVar19->proto)._reader.capTable;
            pvVar4 = (pFVar19->proto)._reader.data;
            pWVar5 = (pFVar19->proto)._reader.pointers;
            uVar6 = (pFVar19->proto)._reader.dataSize;
            uVar7 = (pFVar19->proto)._reader.pointerCount;
            uVar8 = *(undefined2 *)&(pFVar19->proto)._reader.field_0x26;
            field_00.proto._reader._38_2_ = uVar8;
            field_00.proto._reader.pointerCount = uVar7;
            field_00.proto._reader.dataSize = uVar6;
            pOVar20 = kj::mv<capnp::Orphan<capnp::DynamicValue>>(pOVar20);
            field_00.index = pFVar19->index;
            field_00._12_4_ = *(undefined4 *)&pFVar19->field_0xc;
            field_00.parent.super_Schema.raw = (Schema)(Schema)groupBuilder.builder._32_8_;
            field_00.proto._reader.segment = pSVar2;
            field_00.proto._reader.capTable = pCVar3;
            field_00.proto._reader.data = pvVar4;
            field_00.proto._reader.pointers = pWVar5;
            field_00.proto._reader.nestingLimit = (pFVar19->proto)._reader.nestingLimit;
            field_00.proto._reader._44_4_ = *(undefined4 *)&(pFVar19->proto)._reader.field_0x2c;
            DynamicStruct::Builder::adopt(&builder,field_00,pOVar20);
          }
          kj::_::NullableValue<capnp::Orphan<capnp::DynamicValue>_>::~NullableValue
                    ((NullableValue<capnp::Orphan<capnp::DynamicValue>_> *)local_230);
        }
        else if (WVar17 == GROUP) {
          DynamicStruct::Builder::init((Builder *)&local_378,(EVP_PKEY_CTX *)&builder);
          DynamicValue::Builder::as<capnp::DynamicStruct>
                    ((BuilderFor<capnp::DynamicStruct> *)auStack_338,&local_378);
          DynamicValue::Builder::~Builder(&local_378);
          bVar16 = Expression::Reader::isTuple
                             ((Reader *)&_compiledValue2214.field_1.value.builder.location);
          pWVar5 = groupBuilder.builder.pointers;
          pvVar4 = groupBuilder.builder.data;
          pCVar12 = groupBuilder.builder.capTable;
          pSVar11 = groupBuilder.builder.segment;
          SVar10 = groupBuilder.schema;
          auVar9 = auStack_338;
          if (bVar16) {
            Expression::Reader::getTuple
                      ((Reader *)&groupFields.list.reader.nestingLimit,
                       (Reader *)&_compiledValue2214.field_1.value.builder.location);
            builder_00.builder.segment = (SegmentBuilder *)SVar10.super_Schema.raw;
            builder_00.schema.super_Schema.raw = (Schema)(Schema)auVar9;
            builder_00.builder.capTable = (CapTableBuilder *)pSVar11;
            builder_00.builder.data = pCVar12;
            builder_00.builder.pointers = (WirePointer *)pvVar4;
            builder_00.builder._32_8_ = pWVar5;
            assignments_00.reader.capTable = (CapTableReader *)uStack_410;
            assignments_00.reader.segment = (SegmentReader *)groupFields.list.reader._40_8_;
            assignments_00.reader.ptr = (byte *)local_408;
            assignments_00.reader._24_8_ = uStack_400;
            assignments_00.reader._32_8_ = local_3f8;
            assignments_00.reader._40_8_ = uStack_3f0;
            fillStructValue(this,builder_00,assignments_00);
          }
          else {
            groupField.proto._reader._40_8_ =
                 DynamicStruct::Builder::getSchema((Builder *)auStack_338);
            StructSchema::getFields
                      ((FieldList *)local_450,(StructSchema *)&groupField.proto._reader.nestingLimit
                      );
            uVar18 = StructSchema::FieldList::size((FieldList *)local_450);
            if (uVar18 != 0) {
              StructSchema::FieldList::operator[]
                        ((Field *)&result.builder.location,(FieldList *)local_450,0);
              local_4e8 = value._reader.pointers;
              SStack_4e0 = value._reader.dataSize;
              SStack_4dc = value._reader.pointerCount;
              uStack_4da = value._reader._38_2_;
              local_4f8 = value._reader.capTable;
              pvStack_4f0 = value._reader.data;
              local_508 = _compiledValue2214.field_1.value.builder.location;
              pSStack_500 = value._reader.segment;
              TVar22 = StructSchema::Field::getType(pFVar19);
              src_00._reader.capTable = (CapTableReader *)pSStack_500;
              src_00._reader.segment = (SegmentReader *)local_508;
              src_00._reader.data = local_4f8;
              src_00._reader.pointers = (WirePointer *)pvStack_4f0;
              src_00._reader._32_8_ = local_4e8;
              src_00._reader.nestingLimit = SStack_4e0;
              src_00._reader._44_2_ = SStack_4dc;
              src_00._reader._46_2_ = uStack_4da;
              local_518 = TVar22;
              compileValueInner((Orphan<capnp::DynamicValue> *)local_4d0,this,src_00,TVar22);
              local_528 = value._reader.pointers;
              SStack_520 = value._reader.dataSize;
              SStack_51c = value._reader.pointerCount;
              uStack_51a = value._reader._38_2_;
              local_538 = value._reader.capTable;
              pvStack_530 = value._reader.data;
              local_548 = _compiledValue2214.field_1.value.builder.location;
              pSStack_540 = value._reader.segment;
              TVar22 = StructSchema::Field::getType((Field *)&result.builder.location);
              src_01._reader.capTable = (CapTableReader *)pSStack_540;
              src_01._reader.segment = (SegmentReader *)local_548;
              src_01._reader.data = local_538;
              src_01._reader.pointers = (WirePointer *)pvStack_530;
              src_01._reader._32_8_ = local_528;
              src_01._reader.nestingLimit = SStack_520;
              src_01._reader._44_2_ = SStack_51c;
              src_01._reader._46_2_ = uStack_51a;
              local_558 = TVar22;
              bVar16 = matchesType(this,src_01,TVar22,(Orphan<capnp::DynamicValue> *)local_4d0);
              if (bVar16) {
                local_568 = groupField.proto._reader.pointers;
                SStack_560 = groupField.proto._reader.dataSize;
                SStack_55c = groupField.proto._reader.pointerCount;
                uStack_55a = groupField.proto._reader._38_2_;
                local_578 = groupField.proto._reader.capTable;
                pvStack_570 = groupField.proto._reader.data;
                local_588 = groupField.index;
                uStack_584 = groupField._12_4_;
                pSStack_580 = groupField.proto._reader.segment;
                local_598 = result.builder.location;
                SStack_590 = groupField.parent.super_Schema.raw;
                pOVar20 = kj::mv<capnp::Orphan<capnp::DynamicValue>>
                                    ((Orphan<capnp::DynamicValue> *)local_4d0);
                field_01._8_8_ = SStack_590.raw;
                field_01.parent.super_Schema.raw = (Schema)(Schema)local_598;
                field_01.proto._reader.segment = (SegmentReader *)_local_588;
                field_01.proto._reader.capTable = (CapTableReader *)pSStack_580;
                field_01.proto._reader.data = local_578;
                field_01.proto._reader.pointers = (WirePointer *)pvStack_570;
                field_01.proto._reader._32_8_ = local_568;
                field_01.proto._reader.nestingLimit = SStack_560;
                field_01.proto._reader._44_2_ = SStack_55c;
                field_01.proto._reader._46_2_ = uStack_55a;
                DynamicStruct::Builder::adopt((Builder *)auStack_338,field_01,pOVar20);
                local_59c = 4;
              }
              else {
                local_59c = 0;
              }
              Orphan<capnp::DynamicValue>::~Orphan((Orphan<capnp::DynamicValue> *)local_4d0);
              if (local_59c != 0) goto LAB_0016b0be;
            }
            pEVar1 = this->errorReporter;
            kj::StringPtr::StringPtr((StringPtr *)&local_5b0,"Type mismatch; expected group.");
            ErrorReporter::addErrorOn<capnp::compiler::Expression::Reader&>
                      (pEVar1,(Reader *)&_compiledValue2214.field_1.value.builder.location,
                       (StringPtr)local_5b0);
          }
        }
      }
LAB_0016b0be:
      kj::_::NullableValue<capnp::StructSchema::Field>::~NullableValue
                ((NullableValue<capnp::StructSchema::Field> *)local_100);
    }
    else {
      pEVar1 = this->errorReporter;
      Expression::Param::Reader::getValue(&local_618,(Reader *)&fieldName._reader.nestingLimit);
      kj::str<char_const(&)[20]>(&local_640,(kj *)"Missing field name.",params);
      kj::StringPtr::StringPtr((StringPtr *)&local_628,&local_640);
      ErrorReporter::addErrorOn<capnp::compiler::Expression::Reader>
                (pEVar1,&local_618,(StringPtr)local_628);
      kj::String::~String(&local_640);
    }
    capnp::_::
    IndexingIterator<const_capnp::List<capnp::compiler::Expression::Param,_(capnp::Kind)3>::Reader,_capnp::compiler::Expression::Param::Reader>
    ::operator++((IndexingIterator<const_capnp::List<capnp::compiler::Expression::Param,_(capnp::Kind)3>::Reader,_capnp::compiler::Expression::Param::Reader>
                  *)local_28);
  } while( true );
}

Assistant:

void ValueTranslator::fillStructValue(DynamicStruct::Builder builder,
                                      List<Expression::Param>::Reader assignments) {
  for (auto assignment: assignments) {
    if (assignment.isNamed()) {
      auto fieldName = assignment.getNamed();
      KJ_IF_SOME(field, builder.getSchema().findFieldByName(fieldName.getValue())) {
        auto fieldProto = field.getProto();
        auto value = assignment.getValue();

        switch (fieldProto.which()) {
          case schema::Field::SLOT:
            KJ_IF_SOME(compiledValue, compileValue(value, field.getType())) {
              builder.adopt(field, kj::mv(compiledValue));
            }
            break;

          case schema::Field::GROUP:
            auto groupBuilder = builder.init(field).as<DynamicStruct>();
            if (value.isTuple()) {
              fillStructValue(groupBuilder, value.getTuple());
            } else {
              auto groupFields = groupBuilder.getSchema().getFields();
              if (groupFields.size() > 0) {
                auto groupField = groupFields[0];

                // Call compileValueInner() using the group's type as `type`. Since we already
                // established `value` is not a tuple, this will only return a valid result if
                // the value has unambiguous type.
                auto result = compileValueInner(value, field.getType());

                // Does it match the first field?
                if (matchesType(value, groupField.getType(), result)) {
                  groupBuilder.adopt(groupField, kj::mv(result));
                  break;
                }
              }

              errorReporter.addErrorOn(value, "Type mismatch; expected group.");
            }
            break;
        }
      } else {
        errorReporter.addErrorOn(fieldName, kj::str(
            "Struct has no field named '", fieldName.getValue(), "'."));
      }
    } else {
      errorReporter.addErrorOn(assignment.getValue(), kj::str("Missing field name."));
    }
  }
}